

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool File::exists(String *file)

{
  int iVar1;
  char *__file;
  undefined1 local_a8 [8];
  stat buf;
  String *file_local;
  
  buf.__glibc_reserved[2] = (__syscall_slong_t)file;
  __file = String::operator_cast_to_char_(file);
  iVar1 = lstat(__file,(stat *)local_a8);
  return iVar1 == 0;
}

Assistant:

bool File::exists(const String& file)
{
#ifdef _WIN32
  WIN32_FIND_DATA wfd;
  HANDLE hFind = FindFirstFileEx(file, // FindFirstFile is faster than GetFileAttribute
#if _WIN32_WINNT > 0x0600
    FindExInfoBasic,
#else
    FindExInfoStandard,
#endif
    &wfd, FindExSearchNameMatch, NULL, 0);
  if(hFind == INVALID_HANDLE_VALUE)
    return false;
  FindClose(hFind);
  return true;
#else
  struct stat buf;
  if(lstat(file, &buf) != 0)
    return false;
  return true;
#endif
}